

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall
cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
          (cmGeneratorTarget *this,string *p,string *config)

{
  TargetType TVar1;
  CompatibleInterfacesBase *pCVar2;
  const_iterator cVar3;
  
  TVar1 = cmTarget::GetType(this->Target);
  if ((TVar1 != OBJECT_LIBRARY) &&
     (TVar1 = cmTarget::GetType(this->Target), TVar1 != INTERFACE_LIBRARY)) {
    pCVar2 = GetCompatibleInterfaces(this,config);
    cVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(pCVar2->PropsNumberMin)._M_t,p);
    return (_Rb_tree_header *)cVar3._M_node !=
           &(pCVar2->PropsNumberMin)._M_t._M_impl.super__Rb_tree_header;
  }
  return false;
}

Assistant:

bool cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty(
  const std::string& p, const std::string& config) const
{
  if (this->GetType() == cmStateEnums::OBJECT_LIBRARY ||
      this->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
    return false;
  }
  return this->GetCompatibleInterfaces(config).PropsNumberMin.count(p) > 0;
}